

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void InsertDocType(TidyDocImpl *doc,Node *element,Node *doctype)

{
  Node *pNVar1;
  bool bVar2;
  Node *existing;
  Node *doctype_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  pNVar1 = prvTidyFindDocType(doc);
  if (pNVar1 == (Node *)0x0) {
    prvTidyReport(doc,element,doctype,0x236);
    doctype_local = element;
    while( true ) {
      bVar2 = false;
      if ((doctype_local != (Node *)0x0) && (bVar2 = false, doctype_local->tag != (Dict *)0x0)) {
        bVar2 = doctype_local->tag->id == TidyTag_HTML;
      }
      if (bVar2) break;
      doctype_local = doctype_local->parent;
    }
    prvTidyInsertNodeBeforeElement(doctype_local,doctype);
  }
  else {
    prvTidyReport(doc,element,doctype,0x235);
    prvTidyFreeNode(doc,doctype);
  }
  return;
}

Assistant:

static void InsertDocType( TidyDocImpl* doc, Node *element, Node *doctype )
{
    Node* existing = TY_(FindDocType)( doc );
    if ( existing )
    {
        TY_(Report)(doc, element, doctype, DISCARDING_UNEXPECTED );
        TY_(FreeNode)( doc, doctype );
    }
    else
    {
        TY_(Report)(doc, element, doctype, DOCTYPE_AFTER_TAGS );
        while ( !nodeIsHTML(element) )
            element = element->parent;
        TY_(InsertNodeBeforeElement)( element, doctype );
    }
}